

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O0

bool vkb::detail::check_extension_supported
               (vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                *available_extensions,char *extension_name)

{
  bool bVar1;
  int iVar2;
  reference __s2;
  VkExtensionProperties *extension_properties;
  const_iterator __end2;
  const_iterator __begin2;
  vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *__range2;
  char *extension_name_local;
  vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *available_extensions_local;
  
  if (extension_name != (char *)0x0) {
    __end2 = std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::begin
                       (available_extensions);
    extension_properties =
         (VkExtensionProperties *)
         std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::end
                   (available_extensions);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_VkExtensionProperties_*,_std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>_>
                                       *)&extension_properties), bVar1) {
      __s2 = __gnu_cxx::
             __normal_iterator<const_VkExtensionProperties_*,_std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>_>
             ::operator*(&__end2);
      iVar2 = strcmp(extension_name,__s2->extensionName);
      if (iVar2 == 0) {
        return true;
      }
      __gnu_cxx::
      __normal_iterator<const_VkExtensionProperties_*,_std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>_>
      ::operator++(&__end2);
    }
  }
  return false;
}

Assistant:

bool check_extension_supported(std::vector<VkExtensionProperties> const& available_extensions, const char* extension_name) {
    if (!extension_name) return false;
    for (const auto& extension_properties : available_extensions) {
        if (strcmp(extension_name, extension_properties.extensionName) == 0) {
            return true;
        }
    }
    return false;
}